

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O0

RK_U32 vp8hwdDecodeBool(vpBoolCoder_t *bit_ctx,RK_S32 probability)

{
  RK_U32 RVar1;
  uint uVar2;
  bool bVar3;
  uint local_34;
  uint local_30;
  RK_U32 value;
  RK_U32 range;
  RK_U32 count;
  RK_U32 bigsplit;
  RK_U32 split;
  RK_U32 bit;
  RK_S32 probability_local;
  vpBoolCoder_t *bit_ctx_local;
  
  value = bit_ctx->count;
  RVar1 = bit_ctx->range;
  local_34 = bit_ctx->value;
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x43,"vp8hwdDecodeBool"
              );
  }
  uVar2 = ((RVar1 - 1) * probability >> 8) + 1;
  bVar3 = uVar2 * 0x1000000 <= local_34;
  local_30 = uVar2;
  if (bVar3) {
    local_30 = bit_ctx->range - uVar2;
    local_34 = local_34 + uVar2 * -0x1000000;
  }
  bigsplit = (RK_U32)bVar3;
  if (local_30 < 0x80) {
    do {
      local_30 = local_30 * 2;
      local_34 = local_34 * 2;
      value = value - 1;
      if (value == 0) {
        if (bit_ctx->streamEndPos <= bit_ctx->pos) {
          bit_ctx->strmError = 1;
          _mpp_log_l(4,"vp8d_parser","vp8hwdDecodeBool read end",(char *)0x0);
          break;
        }
        value = 8;
        local_34 = bit_ctx->buffer[bit_ctx->pos] | local_34;
        bit_ctx->pos = bit_ctx->pos + 1;
      }
    } while (local_30 < 0x80);
    bit_ctx->count = value;
    bit_ctx->value = local_34;
    bit_ctx->range = local_30;
    if ((vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x6a,
                 "vp8hwdDecodeBool");
    }
  }
  else {
    bit_ctx->value = local_34;
    bit_ctx->range = local_30;
  }
  return bigsplit;
}

Assistant:

static RK_U32 vp8hwdDecodeBool(vpBoolCoder_t *bit_ctx, RK_S32 probability)
{
    RK_U32  bit = 0;
    RK_U32  split;
    RK_U32  bigsplit;
    RK_U32  count = bit_ctx->count;
    RK_U32  range = bit_ctx->range;
    RK_U32  value = bit_ctx->value;

    FUN_T("FUN_IN");
    split = 1 + (((range - 1) * probability) >> 8);
    bigsplit = (split << 24);
    range = split;

    if (value >= bigsplit) {
        range = bit_ctx->range - split;
        value = value - bigsplit;
        bit = 1;
    }

    if (range >= 0x80) {
        bit_ctx->value = value;
        bit_ctx->range = range;
        return bit;
    } else {
        do {
            range += range;
            value += value;

            if (!--count) {
                /* no more stream to read? */
                if (bit_ctx->pos >= bit_ctx->streamEndPos) {
                    bit_ctx->strmError = 1;
                    mpp_log("vp8hwdDecodeBool read end");
                    break;
                }
                count = 8;
                value |=  bit_ctx->buffer[bit_ctx->pos];
                bit_ctx->pos++;
            }
        } while (range < 0x80);
    }


    bit_ctx->count = count;
    bit_ctx->value = value;
    bit_ctx->range = range;

    FUN_T("FUN_OUT");
    return bit;
}